

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_light_calib.cpp
# Opt level: O2

void EstimateError2(structure_light *StructureLightCalib,structlight *StructlightMeasure,
                   vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   *BackProjectError,int imageCount)

{
  double dVar1;
  double dVar2;
  pointer pvVar3;
  double *pdVar4;
  undefined1 (*pauVar5) [16];
  undefined1 auVar6 [16];
  double dVar7;
  ostream *poVar8;
  long lVar9;
  pointer pvVar10;
  long lVar11;
  int ii;
  ulong uVar12;
  bool bVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  float fVar17;
  double dVar18;
  undefined1 local_568 [24];
  double local_550;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  A_pointcloud;
  vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> calcPoint;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  V;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  U;
  int local_4d0;
  int local_4cc;
  vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> CrossPoint;
  vector<float,_std::allocator<float>_> BackProjectErrorTemp;
  vector<double,_std::allocator<double>_> S;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_460;
  undefined1 local_448 [16];
  Mat imagetemp;
  ofstream outfile;
  undefined4 uStack_3d4;
  structlight local_1d0;
  
  CrossPoint.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  CrossPoint.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  CrossPoint.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator=
            (&CrossPoint,&StructureLightCalib->lightPlanePoint);
  calcPoint.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  calcPoint.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  calcPoint.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  structlight::structlight(&local_1d0,StructlightMeasure);
  calc3DCoordination(&local_1d0,
                     (StructureLightCalib->lightPlaneSubpixelImagePoint).
                     super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 4,&calcPoint);
  structlight::~structlight(&local_1d0);
  std::__cxx11::string::string
            ((string *)&outfile,"./light_picture/light4.jpg",(allocator *)&A_pointcloud);
  cv::imread((string *)&imagetemp,(int)&outfile);
  std::__cxx11::string::~string((string *)&outfile);
  for (uVar12 = 0;
      pvVar3 = (StructureLightCalib->lightPlaneSubpixelImagePoint).
               super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      lVar11 = *(long *)&pvVar3[4].
                         super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                         _M_impl.super__Vector_impl_data,
      uVar12 < (ulong)((long)*(pointer *)
                              ((long)&pvVar3[4].
                                      super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                      ._M_impl.super__Vector_impl_data + 8) - lVar11 >> 3);
      uVar12 = uVar12 + 1) {
    A_pointcloud.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    A_pointcloud.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(A_pointcloud.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,0x3010000);
    A_pointcloud.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)&imagetemp;
    local_4d0 = (int)ROUND(*(float *)(lVar11 + uVar12 * 8));
    local_4cc = (int)ROUND(*(float *)(lVar11 + 4 + uVar12 * 8));
    cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&outfile);
    _outfile = 0;
    cv::circle(&A_pointcloud,&local_4d0,1,(string *)&outfile,1,8,0);
  }
  std::__cxx11::string::string((string *)&outfile,"./save/imagetemp.jpg",(allocator *)&S);
  A_pointcloud.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  A_pointcloud.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(A_pointcloud.
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x1010000);
  A_pointcloud.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)&imagetemp;
  U.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  U.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  U.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cv::imwrite((string *)&outfile,(_InputArray *)&A_pointcloud,(vector *)&U);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&U);
  std::__cxx11::string::~string((string *)&outfile);
  A_pointcloud.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  A_pointcloud.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  A_pointcloud.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar11 = 0;
  for (uVar12 = 0;
      uVar12 < (ulong)(((long)calcPoint.
                              super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)calcPoint.
                             super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0xc); uVar12 = uVar12 + 1)
  {
    _outfile = 0;
    U.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)(double)*(float *)((long)&(calcPoint.
                                             super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->x + lVar11)
    ;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              ((vector<double,_std::allocator<double>_> *)&outfile,(double *)&U);
    U.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)(double)*(float *)((long)&(calcPoint.
                                             super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->y + lVar11)
    ;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              ((vector<double,_std::allocator<double>_> *)&outfile,(double *)&U);
    U.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)(double)*(float *)((long)&(calcPoint.
                                             super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->z + lVar11)
    ;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              ((vector<double,_std::allocator<double>_> *)&outfile,(double *)&U);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back(&A_pointcloud,(value_type *)&outfile);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&outfile);
    lVar11 = lVar11 + 0xc;
  }
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar8);
  lVar9 = ((long)A_pointcloud.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)A_pointcloud.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  local_568._0_16_ = ZEXT816(0);
  local_550 = 0.0;
  pvVar10 = A_pointcloud.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar11 = lVar9;
  while (bVar13 = lVar11 != 0, lVar11 = lVar11 + -1, bVar13) {
    pdVar4 = (pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    local_568._8_8_ = (double)local_568._8_8_ + pdVar4[1];
    local_568._0_8_ = (double)local_568._0_8_ + *pdVar4;
    local_550 = local_550 + pdVar4[2];
    pvVar10 = pvVar10 + 1;
  }
  dVar7 = (double)lVar9;
  local_550 = local_550 / dVar7;
  auVar16._8_4_ = SUB84(dVar7,0);
  auVar16._0_8_ = dVar7;
  auVar16._12_4_ = (int)((ulong)dVar7 >> 0x20);
  auVar16 = divpd(local_568._0_16_,auVar16);
  U.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  U.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  U.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  S.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  S.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  S.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  V.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  V.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  V.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar10 = A_pointcloud.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  while (bVar13 = lVar9 != 0, lVar9 = lVar9 + -1, local_568._8_8_ = auVar16._8_8_,
        local_568._0_8_ = auVar16._0_8_, bVar13) {
    pauVar5 = (undefined1 (*) [16])
              (pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    local_568._8_8_ = *(double *)(*pauVar5 + 8) - (double)local_568._8_8_;
    auVar6._8_4_ = (int)local_568._8_8_;
    auVar6._0_8_ = *(double *)*pauVar5 - (double)local_568._0_8_;
    auVar6._12_4_ = (int)((ulong)local_568._8_8_ >> 0x20);
    *pauVar5 = auVar6;
    *(double *)pauVar5[1] = *(double *)pauVar5[1] - local_550;
    pvVar10 = pvVar10 + 1;
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_460,&A_pointcloud);
  svd(&local_460,1,&U,&S,&V);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_460);
  poVar8 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_28595);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  std::operator<<(poVar8," [ ");
  poVar8 = std::ostream::_M_insert<double>
                     (*((V.
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start);
  std::operator<<(poVar8," ");
  poVar8 = std::ostream::_M_insert<double>
                     (((V.
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[1]);
  std::operator<<(poVar8," ");
  poVar8 = std::ostream::_M_insert<double>
                     (((V.
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[2]);
  poVar8 = std::operator<<(poVar8," ] ");
  std::endl<char,std::char_traits<char>>(poVar8);
  BackProjectErrorTemp.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BackProjectErrorTemp.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  BackProjectErrorTemp.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_448._8_4_ = auVar16._8_4_;
  local_448._0_8_ = local_568._8_8_;
  local_448._12_4_ = auVar16._12_4_;
  for (lVar11 = 0; lVar11 != 0x54; lVar11 = lVar11 + 0xc) {
    pdVar4 = ((V.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    fVar14 = *(float *)((long)&CrossPoint.
                               super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[0x1c].x + lVar11);
    fVar15 = *(float *)((long)&CrossPoint.
                               super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[0x1c].y + lVar11);
    dVar7 = *pdVar4;
    dVar1 = pdVar4[1];
    dVar2 = pdVar4[2];
    fVar17 = *(float *)((long)&CrossPoint.
                               super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[0x1c].z + lVar11);
    dVar18 = (double)(float)(-((local_550 - (double)fVar17) * dVar2 +
                              ((double)local_568._0_8_ - (double)fVar14) * dVar7 +
                              ((double)local_448._0_8_ - (double)fVar15) * dVar1) /
                            (dVar2 * dVar2 + dVar7 * dVar7 + dVar1 * dVar1));
    fVar14 = fVar14 - (float)(dVar7 * dVar18 + (double)local_568._0_8_);
    fVar15 = fVar15 - (float)(dVar1 * dVar18 + (double)local_448._0_8_);
    fVar17 = fVar17 - (float)(dVar2 * dVar18 + local_550);
    _outfile = CONCAT44(uStack_3d4,SQRT(fVar17 * fVar17 + fVar14 * fVar14 + fVar15 * fVar15));
    std::vector<float,_std::allocator<float>_>::push_back
              (&BackProjectErrorTemp,(value_type_conflict *)&outfile);
    poVar8 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_285cd);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,_outfile);
    std::endl<char,std::char_traits<char>>(poVar8);
  }
  lVar9 = (long)BackProjectErrorTemp.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)BackProjectErrorTemp.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start >> 2;
  local_568._0_4_ = 0.0;
  for (lVar11 = 0; lVar9 != lVar11; lVar11 = lVar11 + 1) {
    local_568._0_4_ =
         (float)local_568._0_4_ +
         BackProjectErrorTemp.super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_start[lVar11];
  }
  poVar8 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_285e4);
  poVar8 = (ostream *)
           std::ostream::operator<<((ostream *)poVar8,(float)local_568._0_4_ / (float)lVar9);
  std::endl<char,std::char_traits<char>>(poVar8);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::push_back(BackProjectError,&BackProjectErrorTemp);
  std::ofstream::ofstream(&outfile);
  std::ofstream::open((char *)&outfile,0x10e3a7);
  for (lVar11 = 0; lVar11 != 0x54; lVar11 = lVar11 + 0xc) {
    poVar8 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&outfile,
                        *(float *)((long)&CrossPoint.
                                          super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[0x1c].x + lVar11
                                  ));
    std::operator<<(poVar8,"          ");
    poVar8 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&outfile,
                        *(float *)((long)&CrossPoint.
                                          super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[0x1c].y + lVar11
                                  ));
    std::operator<<(poVar8,"          ");
    poVar8 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&outfile,
                        *(float *)((long)&CrossPoint.
                                          super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[0x1c].z + lVar11
                                  ));
    std::operator<<(poVar8,"\n");
  }
  lVar11 = 0;
  for (uVar12 = 0;
      uVar12 < (ulong)(((long)calcPoint.
                              super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)calcPoint.
                             super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0xc); uVar12 = uVar12 + 1)
  {
    poVar8 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&outfile,
                        *(float *)((long)&(calcPoint.
                                           super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->x + lVar11));
    std::operator<<(poVar8,"          ");
    poVar8 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&outfile,
                        *(float *)((long)&(calcPoint.
                                           super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->y + lVar11));
    std::operator<<(poVar8,"          ");
    poVar8 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&outfile,
                        *(float *)((long)&(calcPoint.
                                           super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->z + lVar11));
    std::operator<<(poVar8,"\n");
    lVar11 = lVar11 + 0xc;
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&outfile);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&BackProjectErrorTemp.super__Vector_base<float,_std::allocator<float>_>);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&V);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&S.super__Vector_base<double,_std::allocator<double>_>);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&U);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&A_pointcloud);
  cv::Mat::~Mat(&imagetemp);
  std::_Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::~_Vector_base
            (&calcPoint.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
            );
  std::_Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::~_Vector_base
            (&CrossPoint.
              super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>);
  return;
}

Assistant:

void EstimateError2(structure_light StructureLightCalib, structlight StructlightMeasure, vector<vector<float>> BackProjectError, int imageCount)
{
	/* 评估之前定义靶标的列数和评估的图像编号 */
	int BoardRow = 7;
	int ImageNum = 4;
	/* 首先取出光条和每列圆斑的交点的三维坐标，这是标定（拟合平面）用的 */
	vector<Point3f> CrossPoint;//光条和每列圆斑的交点的三维坐标（所有图的）
	CrossPoint = StructureLightCalib.lightPlanePoint;
	/* 用拟合出来的平面计算光条中心的三维坐标 */
	vector<Point3f> calcPoint;//第ImageNum张图光条中心的三维坐标
	calc3DCoordination(StructlightMeasure, StructureLightCalib.lightPlaneSubpixelImagePoint[ImageNum], calcPoint);
	Mat imagetemp = imread("./light_picture/light4.jpg");
	for (int ii = 0; ii < StructureLightCalib.lightPlaneSubpixelImagePoint[ImageNum].size(); ii++)
	{
		circle(imagetemp, StructureLightCalib.lightPlaneSubpixelImagePoint[ImageNum][ii], 1, Scalar(0, 255, 0));
	}
	imwrite("./save/imagetemp.jpg", imagetemp);
	/*################# 对重构的点云进行直线拟合 #################*/
	/*把坐标转换成矩阵 N*3的矩阵 */
	vector<vector<double>> A_pointcloud;
	for (int i = 0; i < calcPoint.size(); i++)
	{
		vector<double> A_pointcloudTemp;
		A_pointcloudTemp.push_back(calcPoint[i].x);
		A_pointcloudTemp.push_back(calcPoint[i].y);
		A_pointcloudTemp.push_back(calcPoint[i].z);
		A_pointcloud.push_back(A_pointcloudTemp);
	}
	cout << A_pointcloud.size() << endl;
	/* 拟合的直线必过所有坐标的算数平均值 得到直线上一点 */
	double LineX0, LineY0, LineZ0, X_sum = 0, Y_sum = 0, Z_sum = 0;
	for (int i = 0; i < A_pointcloud.size(); i++)
	{
		X_sum = X_sum + A_pointcloud[i][0];
		Y_sum = Y_sum + A_pointcloud[i][1];
		Z_sum = Z_sum + A_pointcloud[i][2];
	}
	LineX0 = X_sum / A_pointcloud.size();
	LineY0 = Y_sum / A_pointcloud.size();
	LineZ0 = Z_sum / A_pointcloud.size();//平均值就是直线经过的点

	/* 协方差矩阵奇异变换（SVD分解）得到直线方向向量 */
	vector<vector<double> > U;
	vector<double> S;
	vector<vector<double> > V;
	for (int i = 0; i < A_pointcloud.size(); i++)
	{
		A_pointcloud[i][0] = A_pointcloud[i][0] - LineX0;
		A_pointcloud[i][1] = A_pointcloud[i][1] - LineY0;
		A_pointcloud[i][2] = A_pointcloud[i][2] - LineZ0;
	}
	svd(A_pointcloud, 1, U, S, V);
	cout << "V矩阵大小 " << V.size() << " [ " << V[0][0] << " " << V[0][1] << " " << V[0][2] << " ] " << endl;
	//直线方程 (x - x0)/m = (y - y0)/n = (z - z0)/p = t ;x0,y0,z0是LineX0，LineY0，LineZ0；m,n,p对应这V的三个元素
	/*################# 拟合完成 #################*/
	/* 计算点之间的最小距离 评估误差 */
	vector<float> BackProjectErrorTemp;
	for (int i = ImageNum * BoardRow; i < (ImageNum + 1) * BoardRow; i++)
	{
		float MinDistacne = sqrt((CrossPoint[i].x - calcPoint[0].x)*(CrossPoint[i].x - calcPoint[0].x)
			+ (CrossPoint[i].y - calcPoint[0].y)*(CrossPoint[i].y - calcPoint[0].y)
			+ (CrossPoint[i].z - calcPoint[0].z)*(CrossPoint[i].z - calcPoint[0].z));
		float t, Xc, Yc, Zc;//t直线方程的参数，Xc,Yc,Zc是标定用的点做直线的垂线的垂足；下边是计算公式，目的是计算标定用点到拟合直线的距离
		t = -(V[0][0] * (LineX0 - CrossPoint[i].x) + V[0][1] * (LineY0 - CrossPoint[i].y) + V[0][2] * (LineZ0 - CrossPoint[i].z)) / (V[0][0] * V[0][0] + V[0][1] * V[0][1] + V[0][2] * V[0][2]);
		Xc = V[0][0] * t + LineX0;
		Yc = V[0][1] * t + LineY0;
		Zc = V[0][2] * t + LineZ0;
		float distance = sqrt((CrossPoint[i].x - Xc)*(CrossPoint[i].x - Xc)
			+ (CrossPoint[i].y - Yc)*(CrossPoint[i].y - Yc)
			+ (CrossPoint[i].z - Zc)*(CrossPoint[i].z - Zc));
		BackProjectErrorTemp.push_back(distance);
		cout << "点到线的距离" << distance << endl;
	}
	/* 计算7个点的平均距离 */
	float DistanceSum = 0, DistanceMaen = 0;
	for (int i = 0; i < BackProjectErrorTemp.size(); i++)
	{
		DistanceSum = DistanceSum + BackProjectErrorTemp[i];
	}
	DistanceMaen = DistanceSum / BackProjectErrorTemp.size();
	cout << "平均距离: " << DistanceMaen << endl;
	BackProjectError.push_back(BackProjectErrorTemp);

	// 将三维坐标写入TXT文件中
	ofstream outfile;
	outfile.open("pointcloud2.txt", ios::binary | ios::in | ios::out);
	for (int k = ImageNum * BoardRow; k < (ImageNum + 1) * BoardRow; k++)
	{
		outfile << CrossPoint[k].x << "          ";
		outfile << CrossPoint[k].y << "          ";
		outfile << CrossPoint[k].z << "\n";
	}
	for (int k = 0; k < calcPoint.size(); k++)
	{
		outfile << calcPoint[k].x << "          ";
		outfile << calcPoint[k].y << "          ";
		outfile << calcPoint[k].z << "\n";
	}
	outfile.close();

}